

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1905.c
# Opt level: O1

int test(char *URL)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int MAX;
  int unfinished;
  timeval timeout;
  long max_tout;
  fd_set E;
  fd_set W;
  fd_set R;
  int local_1e8;
  int local_1e4;
  timeval local_1e0;
  long local_1d0;
  long local_1c8;
  ulong local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  lVar1 = curl_multi_init();
  if (lVar1 == 0) {
    return 1;
  }
  lVar2 = curl_share_init();
  if (lVar2 != 0) {
    curl_share_setopt(lVar2,1,2);
    curl_share_setopt(lVar2,1,2);
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      local_1c8 = lVar2;
      curl_easy_setopt(lVar3,0x2774,lVar2);
      curl_easy_setopt(lVar3,0x2712,URL);
      curl_easy_setopt(lVar3,0x272f,"log/cookies1905");
      curl_easy_setopt(lVar3,0x2762,"log/cookies1905");
      local_1d0 = lVar3;
      curl_multi_add_handle(lVar1,lVar3);
      local_1e4 = 1;
      do {
        local_1e8 = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_138.fds_bits[0] = 0;
        local_138.fds_bits[1] = 0;
        local_138.fds_bits[2] = 0;
        local_138.fds_bits[3] = 0;
        local_138.fds_bits[4] = 0;
        local_138.fds_bits[5] = 0;
        local_138.fds_bits[6] = 0;
        local_138.fds_bits[7] = 0;
        local_138.fds_bits[8] = 0;
        local_138.fds_bits[9] = 0;
        local_138.fds_bits[10] = 0;
        local_138.fds_bits[0xb] = 0;
        local_138.fds_bits[0xc] = 0;
        local_138.fds_bits[0xd] = 0;
        local_138.fds_bits[0xe] = 0;
        local_138.fds_bits[0xf] = 0;
        local_1b8.fds_bits[0] = 0;
        local_1b8.fds_bits[1] = 0;
        local_1b8.fds_bits[2] = 0;
        local_1b8.fds_bits[3] = 0;
        local_1b8.fds_bits[4] = 0;
        local_1b8.fds_bits[5] = 0;
        local_1b8.fds_bits[6] = 0;
        local_1b8.fds_bits[7] = 0;
        local_1b8.fds_bits[8] = 0;
        local_1b8.fds_bits[9] = 0;
        local_1b8.fds_bits[10] = 0;
        local_1b8.fds_bits[0xb] = 0;
        local_1b8.fds_bits[0xc] = 0;
        local_1b8.fds_bits[0xd] = 0;
        local_1b8.fds_bits[0xe] = 0;
        local_1b8.fds_bits[0xf] = 0;
        curl_multi_perform(lVar1,&local_1e4);
        curl_multi_fdset(lVar1,&local_b8,&local_138,&local_1b8,&local_1e8);
        curl_multi_timeout(lVar1,&local_1c0);
        if ((long)local_1c0 < 1) {
          local_1e0.tv_sec = 0;
          local_1e0.tv_usec = 1000;
        }
        else {
          local_1e0.tv_sec = local_1c0 / 1000;
          local_1e0.tv_usec = (local_1c0 % 1000) * 1000;
        }
        select(local_1e8 + 1,&local_b8,&local_138,&local_1b8,&local_1e0);
        lVar3 = local_1d0;
      } while (local_1e4 != 0);
      curl_easy_setopt(local_1d0,0x2797,"FLUSH");
      curl_easy_setopt(lVar3,0x2774,0);
      curl_multi_remove_handle(lVar1,lVar3);
      lVar2 = local_1c8;
      goto LAB_00101518;
    }
  }
  lVar3 = 0;
LAB_00101518:
  curl_easy_cleanup(lVar3);
  curl_share_cleanup(lVar2);
  curl_multi_cleanup(lVar1);
  curl_global_cleanup();
  return 0;
}

Assistant:

int test(char *URL)
{
  CURLSH *sh = NULL;
  CURL *ch = NULL;
  int unfinished;

  CURLM *cm = curl_multi_init();
  if(!cm)
    return 1;
  sh = curl_share_init();
  if(!sh)
    goto cleanup;

  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);

  ch = curl_easy_init();
  if(!ch)
    goto cleanup;

  curl_easy_setopt(ch, CURLOPT_SHARE, sh);
  curl_easy_setopt(ch, CURLOPT_URL, URL);
  curl_easy_setopt(ch, CURLOPT_COOKIEFILE, "log/cookies1905");
  curl_easy_setopt(ch, CURLOPT_COOKIEJAR, "log/cookies1905");

  curl_multi_add_handle(cm, ch);

  unfinished = 1;
  while(unfinished) {
    int MAX = 0;
    long max_tout;
    fd_set R, W, E;
    struct timeval timeout;

    FD_ZERO(&R);
    FD_ZERO(&W);
    FD_ZERO(&E);
    curl_multi_perform(cm, &unfinished);

    curl_multi_fdset(cm, &R, &W, &E, &MAX);
    curl_multi_timeout(cm, &max_tout);

    if(max_tout > 0) {
      timeout.tv_sec = max_tout / 1000;
      timeout.tv_usec = (max_tout % 1000) * 1000;
    }
    else {
      timeout.tv_sec = 0;
      timeout.tv_usec = 1000;
    }

    select(MAX + 1, &R, &W, &E, &timeout);
  }

  curl_easy_setopt(ch, CURLOPT_COOKIELIST, "FLUSH");
  curl_easy_setopt(ch, CURLOPT_SHARE, NULL);

  curl_multi_remove_handle(cm, ch);
  cleanup:
  curl_easy_cleanup(ch);
  curl_share_cleanup(sh);
  curl_multi_cleanup(cm);
  curl_global_cleanup();

  return 0;
}